

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void scalar_select(t_gobj *z,_glist *owner,int state)

{
  t_pd s;
  t_template *template;
  t_symbol *local_70;
  undefined1 local_60 [8];
  t_gpointer gp;
  t_atom at;
  t_symbol *templatesym;
  t_template *tmpl;
  t_scalar *x;
  int state_local;
  _glist *owner_local;
  t_gobj *z_local;
  
  s = z[1].g_pd;
  gpointer_init((t_gpointer *)local_60);
  gpointer_setglist((t_gpointer *)local_60,owner,(t_scalar *)z);
  gp.gp_stub._0_4_ = 3;
  template = template_findbyname((t_symbol *)s);
  if (template != (t_template *)0x0) {
    if (state == 0) {
      local_70 = gensym("deselect");
    }
    else {
      local_70 = gensym("select");
    }
    template_notify(template,local_70,1,(t_atom *)&gp.gp_stub);
  }
  gpointer_unset((t_gpointer *)local_60);
  scalar_drawselectrect((t_scalar *)z,owner,state);
  return;
}

Assistant:

static void scalar_select(t_gobj *z, t_glist *owner, int state)
{
    t_scalar *x = (t_scalar *)z;
    t_template *tmpl;
    t_symbol *templatesym = x->sc_template;
    t_atom at;
    t_gpointer gp;
    gpointer_init(&gp);
    gpointer_setglist(&gp, owner, x);
    SETPOINTER(&at, &gp);
    if ((tmpl = template_findbyname(templatesym)))
        template_notify(tmpl, (state ? gensym("select") : gensym("deselect")),
            1, &at);
    gpointer_unset(&gp);
    scalar_drawselectrect(x, owner, state);
}